

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O2

void __thiscall HEkkDual::majorUpdateFtranFinal(HEkkDual *this)

{
  __atomic_base<int> _Var1;
  int iVar2;
  HVectorBase<double> *this_00;
  HVectorBase<double> *this_01;
  HVector_ptr pHVar3;
  HVector_ptr pHVar4;
  element_type *peVar5;
  bool bVar6;
  char *pcVar7;
  HighsSplitDeque *pHVar8;
  uint uVar9;
  ulong uVar10;
  uint32_t uVar11;
  double dVar12;
  double dVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double pivot;
  TaskGroup tg;
  anon_class_24_4_3f80b2e7_for_functor local_c0;
  double local_a8;
  MFinish *local_a0;
  double *myRow;
  double *myCol;
  double local_88;
  undefined8 uStack_80;
  double local_70;
  double *pivotArray;
  undefined1 local_60 [24];
  double local_48;
  undefined8 uStack_40;
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x46,0);
  local_a0 = this->multi_finish;
  if ((this->dualRHS).workCount < 0) {
    for (dVar12 = 0.0; (long)dVar12 < (long)this->multi_nFinish; dVar12 = (double)((long)dVar12 + 1)
        ) {
      pHVar3 = local_a0[(long)dVar12].col_aq;
      pHVar3->count = -1;
      pHVar4 = local_a0[(long)dVar12].row_ep;
      pHVar4->count = -1;
      myCol = (pHVar3->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
      myRow = (pHVar4->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
      dVar13 = 0.0;
      local_70 = dVar12;
      while (dVar13 != dVar12) {
        iVar2 = local_a0[(long)dVar13].row_out;
        dVar18 = local_a0[(long)dVar13].alpha_row;
        pivotArray = ((local_a0[(long)dVar13].col_aq)->array).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        dVar19 = myRow[iVar2];
        local_88 = dVar13;
        if (1e-14 < ABS(myCol[iVar2])) {
          uStack_40 = 0;
          pivot = myCol[iVar2] / dVar18;
          uVar14 = this->solver_num_row;
          local_60._0_8_ = &myCol;
          local_60._16_8_ = &pivotArray;
          local_a8 = dVar18;
          local_48 = dVar19;
          if ((int)uVar14 < 0x65) {
            local_60._8_8_ = &pivot;
            majorUpdateFtranFinal::anon_class_24_3_5893e9c0::operator()
                      ((anon_class_24_3_5893e9c0 *)local_60,0,uVar14);
          }
          else {
            local_60._8_8_ = &pivot;
            tg.workerDeque = HighsTaskExecutor::getThisWorkerDeque();
            tg.dequeHead = ((tg.workerDeque)->ownerData).head;
            do {
              pHVar8 = tg.workerDeque;
              uVar15 = uVar14 >> 1;
              local_c0.grainSize = 100;
              uVar9 = ((tg.workerDeque)->ownerData).head;
              uVar10 = (ulong)uVar9;
              local_c0.split = uVar15;
              local_c0.end = uVar14;
              if (uVar10 < 0x2000) {
                uVar11 = (uint32_t)(uVar10 + 1);
                ((tg.workerDeque)->ownerData).head = uVar11;
                ((tg.workerDeque)->taskArray)._M_elems[uVar10].metadata.stealer.
                super___atomic_base<unsigned_long>._M_i = 0;
                *(undefined ***)((tg.workerDeque)->taskArray)._M_elems[uVar10].taskData =
                     &PTR_operator___00433638;
                *(anon_class_32_4_8f8caa33 **)
                 (((tg.workerDeque)->taskArray)._M_elems[uVar10].taskData + 0x18) =
                     (anon_class_32_4_8f8caa33 *)local_60;
                pcVar7 = ((tg.workerDeque)->taskArray)._M_elems[uVar10].taskData;
                *(ulong *)(pcVar7 + 8) = CONCAT44(uVar14,uVar15);
                *(ulong *)(pcVar7 + 0x10) = CONCAT44(local_c0._12_4_,100);
                if (((tg.workerDeque)->ownerData).allStolenCopy == true) {
                  ((tg.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
                       uVar10 << 0x20 | uVar10 + 1;
                  ((tg.workerDeque)->stealerData).allStolen._M_base._M_i = false;
                  ((tg.workerDeque)->ownerData).splitCopy = uVar11;
                  ((tg.workerDeque)->ownerData).allStolenCopy = false;
                  if ((((tg.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
                    ((tg.workerDeque)->splitRequest)._M_base._M_i = false;
                  }
                  peVar5 = ((tg.workerDeque)->ownerData).workerBunk.
                           super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                  LOCK();
                  _Var1._M_i = (peVar5->haveJobs).super___atomic_base<int>._M_i;
                  (peVar5->haveJobs).super___atomic_base<int>._M_i =
                       (peVar5->haveJobs).super___atomic_base<int>._M_i + 1;
                  UNLOCK();
                  local_c0.f = (anon_class_32_4_8f8caa33 *)local_60;
                  if (_Var1._M_i < ((tg.workerDeque)->ownerData).numWorkers + -1) {
                    HighsSplitDeque::WorkerBunk::publishWork
                              (((tg.workerDeque)->ownerData).workerBunk.
                               super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,tg.workerDeque);
                  }
                }
                else {
                  local_c0.f = (anon_class_32_4_8f8caa33 *)local_60;
                  HighsSplitDeque::growShared(tg.workerDeque);
                }
              }
              else {
                local_c0.f = (anon_class_32_4_8f8caa33 *)local_60;
                if ((((tg.workerDeque)->ownerData).splitCopy < 0x2000) &&
                   (((tg.workerDeque)->ownerData).allStolenCopy == false)) {
                  HighsSplitDeque::growShared(tg.workerDeque);
                  uVar9 = (pHVar8->ownerData).head;
                }
                (pHVar8->ownerData).head = uVar9 + 1;
                HighsTask::
                Callable<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/parallel/HighsParallel.h:118:16)>
                ::anon_class_24_4_3f80b2e7_for_functor::operator()(&local_c0);
              }
              bVar6 = 0xc9 < uVar14;
              uVar14 = uVar15;
            } while (bVar6);
            majorUpdateFtranFinal::anon_class_24_3_5893e9c0::operator()
                      ((anon_class_24_3_5893e9c0 *)local_60,0,uVar15);
            ::highs::parallel::TaskGroup::taskWait(&tg);
            ::highs::parallel::TaskGroup::~TaskGroup(&tg);
            dVar12 = local_70;
          }
          myCol[iVar2] = pivot;
          dVar18 = local_a8;
          dVar19 = local_48;
        }
        if (1e-14 < ABS(dVar19)) {
          pivot = dVar19 / dVar18;
          uVar14 = this->solver_num_row;
          local_60._0_8_ = &myRow;
          local_60._16_8_ = &pivotArray;
          if ((int)uVar14 < 0x65) {
            local_60._8_8_ = &pivot;
            majorUpdateFtranFinal::anon_class_24_3_5967739a::operator()
                      ((anon_class_24_3_5967739a *)local_60,0,uVar14);
          }
          else {
            local_60._8_8_ = &pivot;
            tg.workerDeque = HighsTaskExecutor::getThisWorkerDeque();
            tg.dequeHead = ((tg.workerDeque)->ownerData).head;
            do {
              pHVar8 = tg.workerDeque;
              uVar15 = uVar14 >> 1;
              local_c0.grainSize = 100;
              uVar9 = ((tg.workerDeque)->ownerData).head;
              uVar10 = (ulong)uVar9;
              local_c0.split = uVar15;
              local_c0.end = uVar14;
              if (uVar10 < 0x2000) {
                uVar11 = (uint32_t)(uVar10 + 1);
                ((tg.workerDeque)->ownerData).head = uVar11;
                ((tg.workerDeque)->taskArray)._M_elems[uVar10].metadata.stealer.
                super___atomic_base<unsigned_long>._M_i = 0;
                *(undefined ***)((tg.workerDeque)->taskArray)._M_elems[uVar10].taskData =
                     &PTR_operator___00433698;
                *(anon_class_32_4_8f8caa33 **)
                 (((tg.workerDeque)->taskArray)._M_elems[uVar10].taskData + 0x18) =
                     (anon_class_32_4_8f8caa33 *)local_60;
                pcVar7 = ((tg.workerDeque)->taskArray)._M_elems[uVar10].taskData;
                *(ulong *)(pcVar7 + 8) = CONCAT44(uVar14,uVar15);
                *(ulong *)(pcVar7 + 0x10) = CONCAT44(local_c0._12_4_,100);
                if (((tg.workerDeque)->ownerData).allStolenCopy == true) {
                  ((tg.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
                       uVar10 << 0x20 | uVar10 + 1;
                  ((tg.workerDeque)->stealerData).allStolen._M_base._M_i = false;
                  ((tg.workerDeque)->ownerData).splitCopy = uVar11;
                  ((tg.workerDeque)->ownerData).allStolenCopy = false;
                  if ((((tg.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
                    ((tg.workerDeque)->splitRequest)._M_base._M_i = false;
                  }
                  peVar5 = ((tg.workerDeque)->ownerData).workerBunk.
                           super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                  LOCK();
                  _Var1._M_i = (peVar5->haveJobs).super___atomic_base<int>._M_i;
                  (peVar5->haveJobs).super___atomic_base<int>._M_i =
                       (peVar5->haveJobs).super___atomic_base<int>._M_i + 1;
                  UNLOCK();
                  local_c0.f = (anon_class_32_4_8f8caa33 *)local_60;
                  if (_Var1._M_i < ((tg.workerDeque)->ownerData).numWorkers + -1) {
                    HighsSplitDeque::WorkerBunk::publishWork
                              (((tg.workerDeque)->ownerData).workerBunk.
                               super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,tg.workerDeque);
                  }
                }
                else {
                  local_c0.f = (anon_class_32_4_8f8caa33 *)local_60;
                  HighsSplitDeque::growShared(tg.workerDeque);
                }
              }
              else {
                local_c0.f = (anon_class_32_4_8f8caa33 *)local_60;
                if ((((tg.workerDeque)->ownerData).splitCopy < 0x2000) &&
                   (((tg.workerDeque)->ownerData).allStolenCopy == false)) {
                  HighsSplitDeque::growShared(tg.workerDeque);
                  uVar9 = (pHVar8->ownerData).head;
                }
                (pHVar8->ownerData).head = uVar9 + 1;
                HighsTask::
                Callable<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/parallel/HighsParallel.h:118:16)>
                ::anon_class_24_4_3f80b2e7_for_functor::operator()(&local_c0);
              }
              bVar6 = 0xc9 < uVar14;
              uVar14 = uVar15;
            } while (bVar6);
            majorUpdateFtranFinal::anon_class_24_3_5967739a::operator()
                      ((anon_class_24_3_5967739a *)local_60,0,uVar15);
            ::highs::parallel::TaskGroup::taskWait(&tg);
            ::highs::parallel::TaskGroup::~TaskGroup(&tg);
            dVar12 = local_70;
          }
          myRow[iVar2] = pivot;
        }
        dVar13 = (double)((long)local_88 + 1);
      }
    }
  }
  else {
    lVar17 = 0;
    dVar12 = 0.0;
    while ((long)dVar12 < (long)this->multi_nFinish) {
      this_00 = local_a0[(long)dVar12].row_ep;
      this_01 = local_a0[(long)dVar12].col_aq;
      local_a8 = dVar12;
      for (lVar16 = 0; lVar17 != lVar16; lVar16 = lVar16 + 0x78) {
        iVar2 = *(int *)((long)&this->multi_finish[0].row_out + lVar16);
        dVar12 = (this_01->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar2];
        if (1e-14 < ABS(dVar12)) {
          local_88 = dVar12 / *(double *)((long)&this->multi_finish[0].alpha_row + lVar16);
          uStack_80 = 0;
          HVectorBase<double>::saxpy<double,double>
                    (this_01,-local_88,
                     *(HVectorBase<double> **)((long)&this->multi_finish[0].col_aq + lVar16));
          (this_01->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2] = local_88;
        }
        dVar12 = (this_00->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar2];
        if (1e-14 < ABS(dVar12)) {
          local_88 = dVar12 / *(double *)((long)&this->multi_finish[0].alpha_row + lVar16);
          uStack_80 = 0;
          HVectorBase<double>::saxpy<double,double>
                    (this_00,-local_88,
                     *(HVectorBase<double> **)((long)&this->multi_finish[0].col_aq + lVar16));
          (this_00->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2] = local_88;
        }
      }
      lVar17 = lVar17 + 0x78;
      dVar12 = (double)((long)local_a8 + 1);
    }
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x46,0);
  return;
}

Assistant:

void HEkkDual::majorUpdateFtranFinal() {
  analysis->simplexTimerStart(FtranMixFinalClock);
  HighsInt updateFTRAN_inDense = dualRHS.workCount < 0;
  if (updateFTRAN_inDense) {
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      multi_finish[iFn].col_aq->count = -1;
      multi_finish[iFn].row_ep->count = -1;
      double* myCol = multi_finish[iFn].col_aq->array.data();
      double* myRow = multi_finish[iFn].row_ep->array.data();
      for (HighsInt jFn = 0; jFn < iFn; jFn++) {
        HighsInt pivotRow = multi_finish[jFn].row_out;
        const double pivotAlpha = multi_finish[jFn].alpha_row;
        const double* pivotArray = multi_finish[jFn].col_aq->array.data();
        double pivotX1 = myCol[pivotRow];
        double pivotX2 = myRow[pivotRow];

        // The FTRAN regular buffer
        if (fabs(pivotX1) > kHighsTiny) {
          const double pivot = pivotX1 / pivotAlpha;
          // #pragma omp parallel for
          highs::parallel::for_each(
              0, solver_num_row,
              [&](HighsInt start, HighsInt end) {
                for (HighsInt i = start; i < end; i++)
                  myCol[i] -= pivot * pivotArray[i];
              },
              100);
          myCol[pivotRow] = pivot;
        }
        // The FTRAN-DSE buffer
        if (fabs(pivotX2) > kHighsTiny) {
          const double pivot = pivotX2 / pivotAlpha;
          // #pragma omp parallel for
          highs::parallel::for_each(
              0, solver_num_row,
              [&](HighsInt start, HighsInt end) {
                for (HighsInt i = start; i < end; i++)
                  myRow[i] -= pivot * pivotArray[i];
              },
              100);
          myRow[pivotRow] = pivot;
        }
      }
    }
  } else {
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      MFinish* finish = &multi_finish[iFn];
      HVector* Col = finish->col_aq;
      HVector* Row = finish->row_ep;
      for (HighsInt jFn = 0; jFn < iFn; jFn++) {
        MFinish* jFinish = &multi_finish[jFn];
        HighsInt pivotRow = jFinish->row_out;
        double pivotX1 = Col->array[pivotRow];
        // The FTRAN regular buffer
        if (fabs(pivotX1) > kHighsTiny) {
          pivotX1 /= jFinish->alpha_row;
          Col->saxpy(-pivotX1, jFinish->col_aq);
          Col->array[pivotRow] = pivotX1;
        }
        // The FTRAN-DSE buffer
        double pivotX2 = Row->array[pivotRow];
        if (fabs(pivotX2) > kHighsTiny) {
          pivotX2 /= jFinish->alpha_row;
          Row->saxpy(-pivotX2, jFinish->col_aq);
          Row->array[pivotRow] = pivotX2;
        }
      }
    }
  }
  analysis->simplexTimerStop(FtranMixFinalClock);
}